

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reusable_string_stream.hpp
# Opt level: O0

ReusableStringStream * __thiscall
Catch::ReusableStringStream::operator<<(ReusableStringStream *this,SwapchainError *value)

{
  basic_ostream<char,_std::char_traits<char>_> *__os;
  error_code local_28;
  SwapchainError *local_18;
  SwapchainError *value_local;
  ReusableStringStream *this_local;
  
  __os = this->m_oss;
  local_18 = value;
  value_local = (SwapchainError *)this;
  std::error_code::error_code<vkb::SwapchainError,void>(&local_28,*value);
  std::operator<<(__os,&local_28);
  return this;
}

Assistant:

auto operator << ( T const& value ) -> ReusableStringStream& {
            *m_oss << value;
            return *this;
        }